

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_do(connectdata *conn,_Bool *done)

{
  Curl_easy *data;
  CURLcode CVar1;
  _Bool connected;
  
  *done = false;
  (conn->proto).ftpc.wait_data_conn = false;
  if ((conn->data->state).wildcardmatch == true) {
    CVar1 = wc_statemach(conn);
    if (((conn->data->wildcard).state | CURLWC_MATCHING) == CURLWC_DONE) {
      return CURLE_OK;
    }
  }
  else {
    CVar1 = ftp_parse_url_path(conn);
  }
  if (CVar1 == CURLE_OK) {
    data = conn->data;
    (data->req).size = -1;
    Curl_pgrsSetUploadCounter(data,0);
    Curl_pgrsSetDownloadCounter(data,0);
    Curl_pgrsSetUploadSize(data,-1);
    Curl_pgrsSetDownloadSize(data,-1);
    (conn->proto).ftpc.ctl_valid = true;
    if ((conn->data->set).opt_no_body == true) {
      *(undefined4 *)((long)(conn->data->req).protop + 0x28) = 1;
    }
    *done = false;
    CVar1 = ftp_state_quote(conn,true,FTP_QUOTE);
    if (CVar1 == CURLE_OK) {
      CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
      *done = (conn->proto).ftpc.state == FTP_STOP;
      connected = (conn->bits).tcpconnect[1];
      Curl_infof(conn->data,"ftp_perform ends with SECONDARY: %d\n",(ulong)connected);
    }
    else {
      connected = false;
    }
    if (CVar1 == CURLE_OK) {
      CVar1 = CURLE_OK;
      if (*done == true) {
        CVar1 = ftp_dophase_done(conn,connected);
        return CVar1;
      }
    }
    else {
      freedirs(&(conn->proto).ftpc);
    }
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(conn->data->state.wildcardmatch) {
    result = wc_statemach(conn);
    if(conn->data->wildcard.state == CURLWC_SKIP ||
      conn->data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(conn);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(conn, done);

  return result;
}